

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSolve_SPGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  undefined8 *puVar1;
  realtype **h;
  realtype *q;
  void *pvVar2;
  realtype *b_00;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  N_Vector p_Var8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  N_Vector *v;
  undefined4 uVar15;
  undefined8 in_RDX;
  long *in_RDI;
  bool bVar16;
  bool bVar17;
  double in_XMM0_Qa;
  realtype rVar18;
  N_Vector *Xv;
  realtype *cv;
  SUNPSolveFn psolve;
  SUNATimesFn atimes;
  void *P_data;
  void *A_data;
  int *nli;
  int gstype;
  int max_restarts;
  int ntries;
  int ier;
  int krydim;
  int l_max;
  int l_plus_1;
  int l;
  int k;
  int j;
  int i;
  int *zeroguess;
  int converged;
  int scale1;
  int scale2;
  int preOnRight;
  int preOnLeft;
  realtype rho;
  realtype s_product;
  realtype r_norm;
  realtype rotation_product;
  realtype beta;
  realtype *res_norm;
  realtype *yg;
  realtype *givens;
  realtype **Hes;
  N_Vector s2;
  N_Vector s1;
  N_Vector vtemp;
  N_Vector xcor;
  N_Vector *V;
  N_Vector in_stack_fffffffffffffeb8;
  N_Vector in_stack_fffffffffffffec0;
  N_Vector in_stack_fffffffffffffec8;
  N_Vector p_Var19;
  N_Vector x_00;
  undefined4 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  bool bVar20;
  undefined1 uVar21;
  bool bVar22;
  undefined1 uVar23;
  realtype *stemp;
  realtype *new_vk_norm;
  undefined8 uVar24;
  realtype **h_00;
  undefined4 in_stack_ffffffffffffff10;
  int iVar25;
  int p;
  int iVar26;
  int iVar27;
  int local_d0;
  int in_stack_ffffffffffffff34;
  int local_c8;
  int local_c4;
  N_Vector local_a0;
  double local_98;
  N_Vector local_90;
  double local_88;
  int local_4;
  
  iVar26 = 0;
  if (in_RDI == (long *)0x0) {
    local_4 = -0x321;
  }
  else {
    iVar27 = *(int *)*in_RDI;
    p = *(int *)(*in_RDI + 0xc);
    iVar25 = *(int *)(*in_RDI + 8);
    puVar1 = *(undefined8 **)(*in_RDI + 0x60);
    h = *(realtype ***)(*in_RDI + 0x68);
    q = *(realtype **)(*in_RDI + 0x70);
    pvVar2 = *(void **)(*in_RDI + 0x78);
    b_00 = *(realtype **)(*in_RDI + 0x80);
    uVar3 = *(undefined8 *)(*in_RDI + 0x88);
    lVar4 = *(long *)(*in_RDI + 0x50);
    lVar5 = *(long *)(*in_RDI + 0x58);
    h_00 = *(realtype ***)(*in_RDI + 0x30);
    uVar24 = *(undefined8 *)(*in_RDI + 0x48);
    new_vk_norm = *(realtype **)(*in_RDI + 0x28);
    stemp = *(realtype **)(*in_RDI + 0x40);
    piVar14 = (int *)(*in_RDI + 0x10);
    v = (N_Vector *)(*in_RDI + 0x14);
    lVar6 = *in_RDI;
    puVar7 = *(undefined8 **)(*in_RDI + 0x90);
    p_Var8 = *(N_Vector *)(*in_RDI + 0x98);
    *(int *)v = 0;
    bVar9 = false;
    bVar22 = true;
    if (*(int *)(*in_RDI + 4) != 1) {
      bVar22 = *(int *)(*in_RDI + 4) == 3;
    }
    bVar20 = true;
    if (*(int *)(*in_RDI + 4) != 2) {
      bVar20 = *(int *)(*in_RDI + 4) == 3;
    }
    bVar16 = lVar4 == 0;
    bVar17 = lVar5 != 0;
    if (new_vk_norm == (realtype *)0x0) {
      *piVar14 = 0;
      *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcdc;
      local_4 = *(int *)(*in_RDI + 0x20);
    }
    else if (((bVar22 == false) && (bVar20 == false)) || (stemp != (realtype *)0x0)) {
      uVar21 = bVar20;
      uVar23 = bVar22;
      if (*piVar14 == 0) {
        iVar10 = (*(code *)new_vk_norm)(h_00,in_RDX,uVar3);
        if (iVar10 != 0) {
          *piVar14 = 0;
          uVar15 = 0x323;
          if (iVar10 < 0) {
            uVar15 = 0xfffffcdb;
          }
          *(undefined4 *)(*in_RDI + 0x20) = uVar15;
          return *(int *)(*in_RDI + 0x20);
        }
        N_VLinearSum((realtype)
                     CONCAT17(uVar23,CONCAT16(uVar21,CONCAT24(in_stack_fffffffffffffed4,
                                                              in_stack_fffffffffffffed0))),
                     in_stack_fffffffffffffec8,(realtype)in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8,(N_Vector)0x11772a3);
      }
      else {
        N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x1177200);
      }
      N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x11772c3);
      if (bVar22 == false) {
        N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x1177375);
      }
      else {
        iVar10 = (*(code *)stemp)(in_XMM0_Qa,uVar24,*puVar1,uVar3,1);
        if (iVar10 != 0) {
          *piVar14 = 0;
          uVar15 = 0x325;
          if (iVar10 < 0) {
            uVar15 = 0xfffffcd8;
          }
          *(undefined4 *)(*in_RDI + 0x20) = uVar15;
          return *(int *)(*in_RDI + 0x20);
        }
      }
      if (bVar16) {
        N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x11773c1);
      }
      else {
        N_VProd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x117739f);
      }
      rVar18 = N_VDotProd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      if (0.0 < rVar18) {
        rVar18 = N_VDotProd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        p_Var19 = (N_Vector)sqrt(rVar18);
      }
      else {
        p_Var19 = (N_Vector)0x0;
      }
      *(double *)(lVar6 + 0x18) = (double)p_Var19;
      if (in_XMM0_Qa < (double)p_Var19) {
        x_00 = p_Var19;
        N_VConst((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        local_a0 = p_Var19;
        local_90 = p_Var19;
        for (iVar10 = 0; iVar10 <= p; iVar10 = iVar10 + 1) {
          for (local_c4 = 0; local_c4 <= iVar27; local_c4 = local_c4 + 1) {
            for (local_c8 = 0; local_c8 < iVar27; local_c8 = local_c8 + 1) {
              h[local_c4][local_c8] = 0.0;
            }
          }
          local_88 = 1.0;
          N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x1177580
                  );
          for (local_d0 = 0; local_d0 < iVar27; local_d0 = local_d0 + 1) {
            *(int *)v = *(int *)v + 1;
            iVar26 = local_d0 + 1;
            iVar13 = iVar26;
            if (bVar17) {
              N_VDiv(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x11775e1);
            }
            else {
              N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (N_Vector)0x1177609);
            }
            if (bVar20 != false) {
              N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (N_Vector)0x117763d);
              iVar11 = (*(code *)stemp)(in_XMM0_Qa,uVar24,puVar1[iVar13],uVar3,2);
              if (iVar11 != 0) {
                *piVar14 = 0;
                uVar15 = 0x325;
                if (iVar11 < 0) {
                  uVar15 = 0xfffffcd8;
                }
                *(undefined4 *)(*in_RDI + 0x20) = uVar15;
                return *(int *)(*in_RDI + 0x20);
              }
            }
            iVar11 = (*(code *)new_vk_norm)(h_00,uVar3,puVar1[iVar13]);
            if (iVar11 != 0) {
              *piVar14 = 0;
              uVar15 = 0x323;
              if (iVar11 < 0) {
                uVar15 = 0xfffffcdb;
              }
              *(undefined4 *)(*in_RDI + 0x20) = uVar15;
              return *(int *)(*in_RDI + 0x20);
            }
            if (bVar22 == false) {
              N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (N_Vector)0x11777ff);
            }
            else {
              iVar11 = (*(code *)stemp)(in_XMM0_Qa,uVar24,puVar1[iVar13],uVar3,1);
              if (iVar11 != 0) {
                *piVar14 = 0;
                uVar15 = 0x325;
                if (iVar11 < 0) {
                  uVar15 = 0xfffffcd8;
                }
                *(undefined4 *)(*in_RDI + 0x20) = uVar15;
                return *(int *)(*in_RDI + 0x20);
              }
              iVar11 = 0;
            }
            if (bVar16) {
              N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (N_Vector)0x1177857);
            }
            else {
              N_VProd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x117782f);
            }
            if (iVar25 == 2) {
              in_stack_fffffffffffffeb8 = p_Var8;
              iVar12 = SUNClassicalGS(v,h_00,(int)((ulong)uVar24 >> 0x20),(int)uVar24,new_vk_norm,
                                      stemp,(N_Vector *)CONCAT44(iVar26,iVar11));
              if (iVar12 != 0) {
                *piVar14 = 0;
                *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd6;
                return *(int *)(*in_RDI + 0x20);
              }
            }
            else {
              iVar12 = SUNModifiedGS((N_Vector *)CONCAT44(iVar13,iVar27),
                                     (realtype **)CONCAT44(iVar26,iVar11),iVar10,p,
                                     (realtype *)CONCAT44(iVar25,in_stack_ffffffffffffff10));
              if (iVar12 != 0) {
                *piVar14 = 0;
                *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd6;
                return *(int *)(*in_RDI + 0x20);
              }
            }
            iVar13 = SUNQRfact(in_stack_ffffffffffffff34,(realtype **)CONCAT44(iVar13,iVar27),
                               (realtype *)CONCAT44(iVar26,iVar11),iVar10);
            if (iVar13 != 0) {
              *piVar14 = 0;
              *(undefined4 *)(*in_RDI + 0x20) = 0x327;
              return *(int *)(*in_RDI + 0x20);
            }
            local_88 = q[local_d0 * 2 + 1] * local_88;
            local_a0 = (N_Vector)ABS(local_88 * (double)local_90);
            *(double *)(lVar6 + 0x18) = (double)local_a0;
            if ((double)local_a0 <= in_XMM0_Qa) {
              bVar9 = true;
              break;
            }
            N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (N_Vector)0x1177a8e);
          }
          *b_00 = (realtype)local_90;
          for (local_c4 = 1; local_c4 <= iVar26; local_c4 = local_c4 + 1) {
            b_00[local_c4] = 0.0;
          }
          iVar13 = SUNQRsol(iVar26,h,q,b_00);
          if (iVar13 != 0) {
            *piVar14 = 0;
            *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd5;
            return *(int *)(*in_RDI + 0x20);
          }
          *puVar7 = 0x3ff0000000000000;
          p_Var8->content = pvVar2;
          for (iVar13 = 0; iVar13 < iVar26; iVar13 = iVar13 + 1) {
            puVar7[iVar13 + 1] = b_00[iVar13];
            (&p_Var8->content)[iVar13 + 1] = (void *)puVar1[iVar13];
          }
          iVar13 = N_VLinearCombination
                             (CONCAT13(uVar23,CONCAT12(uVar21,in_stack_fffffffffffffed4)),
                              (realtype *)x_00,(N_Vector *)in_stack_fffffffffffffec0,
                              in_stack_fffffffffffffeb8);
          if (iVar13 != 0) {
            *piVar14 = 0;
            *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd4;
            return -0x32c;
          }
          if (bVar9) {
            if (bVar17) {
              N_VDiv(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x1177c6e);
            }
            if (bVar20 == false) {
              N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (N_Vector)0x1177d1a);
            }
            else {
              iVar26 = (*(code *)stemp)(in_XMM0_Qa,uVar24,pvVar2,uVar3,2);
              if (iVar26 != 0) {
                *piVar14 = 0;
                uVar15 = 0x325;
                if (iVar26 < 0) {
                  uVar15 = 0xfffffcd8;
                }
                *(undefined4 *)(*in_RDI + 0x20) = uVar15;
                return *(int *)(*in_RDI + 0x20);
              }
            }
            if (*piVar14 == 0) {
              N_VLinearSum((realtype)
                           CONCAT17(uVar23,CONCAT16(uVar21,CONCAT24(in_stack_fffffffffffffed4,
                                                                    in_stack_fffffffffffffed0))),
                           x_00,(realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                           (N_Vector)0x1177d6e);
            }
            else {
              N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (N_Vector)0x1177d44);
            }
            *piVar14 = 0;
            *(undefined4 *)(*in_RDI + 0x20) = 0;
            return *(int *)(*in_RDI + 0x20);
          }
          if (iVar10 == p) break;
          local_98 = 1.0;
          for (local_c4 = iVar26; 0 < local_c4; local_c4 = local_c4 + -1) {
            b_00[local_c4] = local_98 * q[local_c4 * 2 + -2];
            local_98 = q[local_c4 * 2 + -1] * local_98;
          }
          *b_00 = local_98;
          for (local_c4 = 0; local_c4 <= iVar26; local_c4 = local_c4 + 1) {
            b_00[local_c4] = local_98 * (double)local_90 * b_00[local_c4];
          }
          local_90 = (N_Vector)ABS(local_98 * (double)local_90);
          for (in_stack_ffffffffffffff34 = 0; in_stack_ffffffffffffff34 <= iVar26;
              in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + 1) {
            puVar7[in_stack_ffffffffffffff34] = b_00[in_stack_ffffffffffffff34];
            (&p_Var8->content)[in_stack_ffffffffffffff34] =
                 (void *)puVar1[in_stack_ffffffffffffff34];
          }
          iVar13 = N_VLinearCombination
                             (CONCAT13(uVar23,CONCAT12(uVar21,in_stack_fffffffffffffed4)),
                              (realtype *)x_00,(N_Vector *)in_stack_fffffffffffffec0,
                              in_stack_fffffffffffffeb8);
          if (iVar13 != 0) {
            *piVar14 = 0;
            *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd4;
            return -0x32c;
          }
        }
        if ((double)p_Var19 <= (double)local_a0) {
          *piVar14 = 0;
          *(undefined4 *)(*in_RDI + 0x20) = 0x322;
          local_4 = *(int *)(*in_RDI + 0x20);
        }
        else {
          if (bVar17) {
            N_VDiv(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(N_Vector)0x1178006);
          }
          if (bVar20 == false) {
            N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (N_Vector)0x11780b2);
          }
          else {
            iVar26 = (*(code *)stemp)(in_XMM0_Qa,uVar24,pvVar2,uVar3,2);
            if (iVar26 != 0) {
              *piVar14 = 0;
              uVar15 = 0x325;
              if (iVar26 < 0) {
                uVar15 = 0xfffffcd8;
              }
              *(undefined4 *)(*in_RDI + 0x20) = uVar15;
              return *(int *)(*in_RDI + 0x20);
            }
          }
          if (*piVar14 == 0) {
            N_VLinearSum((realtype)
                         CONCAT17(uVar23,CONCAT16(uVar21,CONCAT24(in_stack_fffffffffffffed4,
                                                                  in_stack_fffffffffffffed0))),x_00,
                         (realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         (N_Vector)0x1178106);
          }
          else {
            N_VScale((realtype)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (N_Vector)0x11780dc);
          }
          *piVar14 = 0;
          *(undefined4 *)(*in_RDI + 0x20) = 0x321;
          local_4 = *(int *)(*in_RDI + 0x20);
        }
      }
      else {
        *piVar14 = 0;
        *(undefined4 *)(*in_RDI + 0x20) = 0;
        local_4 = *(int *)(*in_RDI + 0x20);
      }
    }
    else {
      *piVar14 = 0;
      *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd9;
      local_4 = *(int *)(*in_RDI + 0x20);
    }
  }
  return local_4;
}

Assistant:

int SUNLinSolSolve_SPGMR(SUNLinearSolver S, SUNMatrix A, N_Vector x,
                         N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  N_Vector *V, xcor, vtemp, s1, s2;
  realtype **Hes, *givens, *yg, *res_norm;
  realtype beta, rotation_product, r_norm, s_product, rho;
  booleantype preOnLeft, preOnRight, scale2, scale1, converged;
  booleantype *zeroguess;
  int i, j, k, l, l_plus_1, l_max, krydim, ier, ntries, max_restarts, gstype;
  int *nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;

  /* local shortcuts for fused vector operations */
  realtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  l_plus_1 = 0;
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPGMR_CONTENT(S)->maxl;
  max_restarts = SPGMR_CONTENT(S)->max_restarts;
  gstype       = SPGMR_CONTENT(S)->gstype;
  V            = SPGMR_CONTENT(S)->V;
  Hes          = SPGMR_CONTENT(S)->Hes;
  givens       = SPGMR_CONTENT(S)->givens;
  xcor         = SPGMR_CONTENT(S)->xcor;
  yg           = SPGMR_CONTENT(S)->yg;
  vtemp        = SPGMR_CONTENT(S)->vtemp;
  s1           = SPGMR_CONTENT(S)->s1;
  s2           = SPGMR_CONTENT(S)->s2;
  A_data       = SPGMR_CONTENT(S)->ATData;
  P_data       = SPGMR_CONTENT(S)->PData;
  atimes       = SPGMR_CONTENT(S)->ATimes;
  psolve       = SPGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPGMR_CONTENT(S)->zeroguess);
  nli          = &(SPGMR_CONTENT(S)->numiters);
  res_norm     = &(SPGMR_CONTENT(S)->resnorm);
  cv           = SPGMR_CONTENT(S)->cv;
  Xv           = SPGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* Set booleantype flags for internal solver options */
  preOnLeft  = ( (SPGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
                 (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH) );
  preOnRight = ( (SPGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                 (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH) );
  scale1 = (s1 != NULL);
  scale2 = (s2 != NULL);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
      && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
    fprintf(SPGMR_CONTENT(S)->info_file, "SUNLINSOL_SPGMR:\n");
#endif

  /* Check if Atimes function has been set */
  if (atimes == NULL) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_ATIMES_NULL;
    return(LASTFLAG(S));
  }

  /* If preconditioning, check if psolve has been set */
  if ((preOnLeft || preOnRight) && psolve == NULL) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_PSOLVE_NULL;
    return(LASTFLAG(S));
  }

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess) {
    N_VScale(ONE, b, vtemp);
  } else {
    ier = atimes(A_data, x, vtemp);
    if (ier != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
  }
  N_VScale(ONE, vtemp, V[0]);

  /* Apply left preconditioner and left scaling to V[0] = r_0 */
  if (preOnLeft) {
    ier = psolve(P_data, V[0], vtemp, delta, SUN_PREC_LEFT);
    if (ier != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
      return(LASTFLAG(S));
    }
  } else {
    N_VScale(ONE, V[0], vtemp);
  }

  if (scale1) {
    N_VProd(s1, vtemp, V[0]);
  } else {
    N_VScale(ONE, vtemp, V[0]);
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 P1_inv r_0, and
     return if small  */
  *res_norm = r_norm = beta = SUNRsqrt(N_VDotProd(V[0], V[0]));

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* print initial residual */
  if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
      && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
  {
    fprintf(SPGMR_CONTENT(S)->info_file,
            SUNLS_MSG_RESIDUAL,
            (long int) 0, *res_norm);
  }
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
    "SUNLinSolSolve_SPGMR", "initial-residual",
    "nli = %li, resnorm = %.16g", (long int) 0, *res_norm);
#endif

  if (r_norm <= delta) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0 */
  N_VConst(ZERO, xcor);

  /* Begin outer iterations: up to (max_restarts + 1) attempts */
  for (ntries=0; ntries<=max_restarts; ntries++) {

    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0] */
    for (i=0; i<=l_max; i++)
      for (j=0; j<l_max; j++)
        Hes[i][j] = ZERO;

    rotation_product = ONE;
    N_VScale(ONE/r_norm, V[0], V[0]);

    /* Inner loop: generate Krylov sequence and Arnoldi basis */
    for (l=0; l<l_max; l++) {
      (*nli)++;
      krydim = l_plus_1 = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 P1_inv A P2_inv s2_inv */

      /*   Apply right scaling: vtemp = s2_inv V[l] */
      if (scale2) N_VDiv(V[l], s2, vtemp);
      else N_VScale(ONE, V[l], vtemp);

      /*   Apply right preconditioner: vtemp = P2_inv s2_inv V[l] */
      if (preOnRight) {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        ier = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_RIGHT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      }

      /* Apply A: V[l+1] = A P2_inv s2_inv V[l] */
      ier = atimes( A_data, vtemp, V[l_plus_1] );
      if (ier != 0) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
        return(LASTFLAG(S));
      }

      /* Apply left preconditioning: vtemp = P1_inv A P2_inv s2_inv V[l] */
      if (preOnLeft) {
        ier = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_LEFT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      } else {
        N_VScale(ONE, V[l_plus_1], vtemp);
      }

      /* Apply left scaling: V[l+1] = s1 P1_inv A P2_inv s2_inv V[l] */
      if (scale1) {
        N_VProd(s1, vtemp, V[l_plus_1]);
      } else {
        N_VScale(ONE, vtemp, V[l_plus_1]);
      }

      /*  Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde */
      if (gstype == SUN_CLASSICAL_GS) {
        if (SUNClassicalGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l]),
                           cv, Xv) != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      } else {
        if (SUNModifiedGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l])) != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      }

      /*  Update the QR factorization of Hes */
      if(SUNQRfact(krydim, Hes, givens, l) != 0 ) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return(LASTFLAG(S));
      }

      /*  Update residual norm estimate; break if convergence test passes */
      rotation_product *= givens[2*l+1];
      *res_norm = rho = SUNRabs(rotation_product*r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      /* print current iteration number and the residual */
      if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
          && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
      {
        fprintf(SPGMR_CONTENT(S)->info_file,
                SUNLS_MSG_RESIDUAL,
                (long int) *nli, *res_norm);
      }
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
        "SUNLinSolSolve_SPGMR", "iterate-residual",
        "nli = %li, resnorm = %.16g", (long int) *nli, *res_norm);
#endif

      if (rho <= delta) { converged = SUNTRUE; break; }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine */
      N_VScale(ONE/Hes[l_plus_1][l], V[l_plus_1], V[l_plus_1]);
    }

    /* Inner loop is done.  Compute the new correction vector xcor */

    /*   Construct g, then solve for y */
    yg[0] = r_norm;
    for (i=1; i<=krydim; i++) yg[i]=ZERO;
    if (SUNQRsol(krydim, Hes, givens, yg) != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return(LASTFLAG(S));
    }

    /*   Add correction vector V_l y to xcor */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k=0; k<krydim; k++) {
      cv[k+1] = yg[k];
      Xv[k+1] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, xcor);
    if (ier != SUNLS_SUCCESS) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_VECTOROP_ERR;
      return(SUNLS_VECTOROP_ERR);
    }

    /* If converged, construct the final solution vector x and return */
    if (converged) {

      /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
      if (scale2) N_VDiv(xcor, s2, xcor);
      if (preOnRight) {
        ier = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      } else {
        N_VScale(ONE, xcor, vtemp);
      }

      /* Add vtemp to initial x to get final solution x, and return */
      if (*zeroguess)
        N_VScale(ONE, vtemp, x);
      else
        N_VLinearSum(ONE, x, ONE, vtemp, x);

      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_SUCCESS;
      return(LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart */
    if (ntries == max_restarts) break;

    /* Construct last column of Q in yg */
    s_product = ONE;
    for (i=krydim; i>0; i--) {
      yg[i] = s_product*givens[2*i-2];
      s_product *= givens[2*i-1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg */
    r_norm *= s_product;
    for (i=0; i<=krydim; i++)
      yg[i] *= r_norm;
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart */
    for (k=0; k<=krydim; k++) {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, V[0]);
    if (ier != SUNLS_SUCCESS) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_VECTOROP_ERR;
      return(SUNLS_VECTOROP_ERR);
    }

  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta) {

    /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
    if (scale2) N_VDiv(xcor, s2, xcor);
    if (preOnRight) {
      ier = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
      if (ier != 0) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    } else {
      N_VScale(ONE, xcor, vtemp);
    }

    /* Add vtemp to initial x to get final solution x, and return */
    if (*zeroguess)
      N_VScale(ONE, vtemp, x);
    else
      N_VLinearSum(ONE, x, ONE, vtemp, x);

    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;
    return(LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return(LASTFLAG(S));
}